

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

Edge * __thiscall
S2LaxPolygonShape::chain_edge(Edge *__return_storage_ptr__,S2LaxPolygonShape *this,int i,int j)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  type pVVar5;
  type pVVar6;
  int local_c4;
  int base;
  int k;
  int n;
  S2LogMessageVoidify local_45 [20];
  byte local_31;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  int local_18;
  int local_14;
  int j_local;
  int i_local;
  S2LaxPolygonShape *this_local;
  
  local_18 = j;
  local_14 = i;
  _j_local = this;
  iVar2 = num_loops(this);
  local_31 = 0;
  if (iVar2 <= i) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xd3,kFatal,(ostream *)&std::cerr);
    local_31 = 1;
    poVar4 = S2LogMessage::stream(&local_30);
    poVar4 = std::operator<<(poVar4,"Check failed: (i) < (num_loops()) ");
    S2LogMessageVoidify::operator&(&local_19,poVar4);
  }
  iVar2 = local_18;
  if ((local_31 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
  }
  iVar3 = num_loop_vertices(this,local_14);
  if (iVar3 <= iVar2) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&n,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2lax_polygon_shape.cc"
               ,0xd4,kFatal,(ostream *)&std::cerr);
    poVar4 = S2LogMessage::stream((S2LogMessage *)&n);
    poVar4 = std::operator<<(poVar4,"Check failed: (j) < (num_loop_vertices(i)) ");
    S2LogMessageVoidify::operator&(local_45,poVar4);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&n);
  }
  iVar2 = num_loop_vertices(this,local_14);
  if (local_18 + 1 == iVar2) {
    local_c4 = 0;
  }
  else {
    local_c4 = local_18 + 1;
  }
  iVar2 = num_loops(this);
  if (iVar2 == 1) {
    pVVar5 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,(long)local_18);
    pVVar6 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,(long)local_c4);
    S2Shape::Edge::Edge(__return_storage_ptr__,pVVar5,pVVar6);
  }
  else {
    uVar1 = (this->field_2).cumulative_vertices_[local_14];
    pVVar5 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,(long)(int)(uVar1 + local_18));
    pVVar6 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::operator[]
                       (&this->vertices_,(long)(int)(uVar1 + local_c4));
    S2Shape::Edge::Edge(__return_storage_ptr__,pVVar5,pVVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Shape::Edge S2LaxPolygonShape::chain_edge(int i, int j) const {
  S2_DCHECK_LT(i, num_loops());
  S2_DCHECK_LT(j, num_loop_vertices(i));
  int n = num_loop_vertices(i);
  int k = (j + 1 == n) ? 0 : j + 1;
  if (num_loops() == 1) {
    return Edge(vertices_[j], vertices_[k]);
  } else {
    int base = cumulative_vertices_[i];
    return Edge(vertices_[base + j], vertices_[base + k]);
  }
}